

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

ostream * fasttext::operator<<(ostream *os,Vector *v)

{
  pointer pfVar1;
  undefined8 in_RAX;
  pointer pfVar2;
  ostream *poVar3;
  long lVar4;
  undefined8 uStack_28;
  
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 5;
  pfVar2 = (v->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (v->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar1 != pfVar2 && -1 < (long)pfVar1 - (long)pfVar2) {
    lVar4 = 0;
    uStack_28 = in_RAX;
    do {
      poVar3 = std::ostream::_M_insert<double>((double)pfVar2[lVar4]);
      uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 7),1);
      lVar4 = lVar4 + 1;
      pfVar2 = (v->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar4 < (long)(v->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar2 >> 2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector& v) {
  os << std::setprecision(5);
  for (int64_t j = 0; j < v.size(); j++) {
    os << v[j] << ' ';
  }
  return os;
}